

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

QGraphicsLayoutItem * __thiscall
QGraphicsLinearLayout::itemAt(QGraphicsLinearLayout *this,int index)

{
  int iVar1;
  QGraphicsLinearLayoutPrivate *pQVar2;
  QGraphicsGridLayoutEngineItem *this_00;
  uint in_ESI;
  long in_FS_OFFSET;
  QGraphicsGridLayoutEngineItem *gridItem;
  QGraphicsLayoutItem *item;
  QGraphicsLinearLayoutPrivate *d;
  char *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QGraphicsLayoutItem *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsLinearLayout *)0x9b7999);
  if (((int)in_ESI < 0) ||
     (in_stack_ffffffffffffffa4 = in_ESI, iVar1 = QGridLayoutEngine::itemCount(),
     iVar1 <= (int)in_stack_ffffffffffffffa4)) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,"QGraphicsLinearLayout::itemAt: invalid index %d",(ulong)in_ESI);
    local_30 = (QGraphicsLayoutItem *)0x0;
  }
  else {
    local_30 = (QGraphicsLayoutItem *)0x0;
    this_00 = (QGraphicsGridLayoutEngineItem *)QGridLayoutEngine::itemAt((int)pQVar2 + 0x118);
    if (this_00 != (QGraphicsGridLayoutEngineItem *)0x0) {
      local_30 = QGraphicsGridLayoutEngineItem::layoutItem(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QGraphicsLayoutItem *QGraphicsLinearLayout::itemAt(int index) const
{
    Q_D(const QGraphicsLinearLayout);
    if (index < 0 || index >= d->engine.itemCount()) {
        qWarning("QGraphicsLinearLayout::itemAt: invalid index %d", index);
        return nullptr;
    }
    QGraphicsLayoutItem *item = nullptr;
    if (QGraphicsGridLayoutEngineItem *gridItem = static_cast<QGraphicsGridLayoutEngineItem *>(d->engine.itemAt(index)))
        item = gridItem->layoutItem();
    return item;
}